

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.c
# Opt level: O1

int wwCmpW(word *a,size_t n,word w)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  long lVar4;
  
  if (n != 0) {
    lVar4 = n - 1;
    if (lVar4 == 0) {
      uVar1 = 1;
    }
    else {
      uVar2 = 0;
      do {
        uVar2 = uVar2 | a[lVar4];
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
      uVar1 = (uint)(uVar2 == 0);
    }
    uVar3 = 0xffffffff;
    if (w <= *a) {
      uVar3 = (uint)(w < *a);
    }
    return uVar1 ^ 1 | -uVar1 & uVar3;
  }
  return -(uint)(w != 0);
}

Assistant:

int SAFE(wwCmpW)(const word a[], size_t n, register word w)
{
	register int ret;
	ASSERT(wwIsValid(a, n));
	if (n == 0)
		ret = wordEq(w, 0) - 1;
	else
	{
		register int z = wwIsZero(a + 1, n - 1);
		ret = -wordLess(a[0], w) & -1 | -wordGreater(a[0], w) & 1;
		ret = -z & ret | (z - 1) & 1;
		z = 0;
	}
	w = 0;
	return ret;
}